

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.c
# Opt level: O0

void message_display(tgestate_t *state)

{
  byte bVar1;
  char *pcVar2;
  tgestate_t *in_RDI;
  uint8_t *pscr;
  char *pmsgchr;
  uint8_t index;
  char *in_stack_ffffffffffffffd8;
  tgestate_t *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->messages).display_delay == '\0') {
    bVar1 = (in_RDI->messages).display_index;
    if (bVar1 == 0x80) {
      next_message(in_RDI);
    }
    else if (bVar1 < 0x81) {
      pcVar2 = (in_RDI->messages).current_character;
      plot_glyph((tgestate_t *)((in_RDI->speccy->screen).pixels + (int)(bVar1 + 0x10e0)),
                 in_stack_ffffffffffffffd8,(uint8_t *)0x114674);
      (in_RDI->messages).display_index = bVar1 + 1;
      if (pcVar2[1] == '\0') {
        (in_RDI->messages).display_delay = '\x1f';
        (in_RDI->messages).display_index = (in_RDI->messages).display_index | 0x80;
      }
      else {
        (in_RDI->messages).current_character = pcVar2 + 1;
      }
    }
    else {
      wipe_message(in_stack_ffffffffffffffe0);
    }
  }
  else {
    (in_RDI->messages).display_delay = (in_RDI->messages).display_delay + 0xff;
  }
  return;
}

Assistant:

void message_display(tgestate_t *state)
{
  uint8_t     index;   /* was A */
  const char *pmsgchr; /* was HL */
  uint8_t    *pscr;    /* was DE */

  assert(state != NULL);

  /* Proceed only if message_display_counter is zero. */
  if (state->messages.display_delay > 0)
  {
    state->messages.display_delay--;
    return;
  }

  index = state->messages.display_index;
  if (index == MESSAGE_NEXT_FLAG)
  {
    next_message(state);
  }
  else if (index > MESSAGE_NEXT_FLAG)
  {
    wipe_message(state);
  }
  else
  {
    pmsgchr = state->messages.current_character;
    pscr    = &state->speccy->screen.pixels[screen_text_start_address + index];
    (void) plot_glyph(state, pmsgchr, pscr);

    state->messages.display_index = index + 1; // Conv: Original used (pscr & 31). CHECK

    if (*++pmsgchr == '\0') /* end of string (0xFF in original game) */
    {
      /* Leave the message for 31 turns, then wipe it. */
      state->messages.display_delay = 31;
      state->messages.display_index |= MESSAGE_NEXT_FLAG;
    }
    else
    {
      state->messages.current_character = pmsgchr;
    }
  }
}